

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printLevelMode(LevelMode lm)

{
  long lVar1;
  char *pcVar2;
  
  if (lm == RIPMAP_LEVELS) {
    pcVar2 = "rip-map";
  }
  else {
    if (lm != MIPMAP_LEVELS) {
      if (lm != ONE_LEVEL) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"level mode ",0xb);
        std::ostream::operator<<((ostream *)&std::cout,lm);
        return;
      }
      pcVar2 = "single level";
      lVar1 = 0xc;
      goto LAB_001036bd;
    }
    pcVar2 = "mip-map";
  }
  lVar1 = 7;
LAB_001036bd:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
  return;
}

Assistant:

void
printLevelMode (LevelMode lm)
{
    switch (lm)
    {
        case ONE_LEVEL: cout << "single level"; break;

        case MIPMAP_LEVELS: cout << "mip-map"; break;

        case RIPMAP_LEVELS: cout << "rip-map"; break;

        default: cout << "level mode " << int (lm); break;
    }
}